

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

bool __thiscall
Inline::SplitConstructorCall
          (Inline *this,Instr *newObjInstr,bool isInlined,bool isFixed,Instr **createObjInstrOut,
          Instr **callCtorInstrOut)

{
  undefined1 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (newObjInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1107,"(newObjInstr)","newObjInstr");
    if (!bVar3) goto LAB_0054d26b;
    *puVar4 = 0;
  }
  if (newObjInstr->m_opcode != NewScObject) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1108,"(newObjInstr->m_opcode == Js::OpCode::NewScObject)",
                       "newObjInstr->m_opcode == Js::OpCode::NewScObject");
    if (!bVar3) goto LAB_0054d26b;
    *puVar4 = 0;
  }
  if (newObjInstr->m_src1 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x1109,"(newObjInstr->GetSrc1())","newObjInstr->GetSrc1()");
    if (!bVar3) goto LAB_0054d26b;
    *puVar4 = 0;
  }
  if (newObjInstr->m_src2 == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x110a,"(newObjInstr->GetSrc2())","newObjInstr->GetSrc2()");
    if (!bVar3) {
LAB_0054d26b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  puVar1 = &this->topFunc->field_0x240;
  *(uint *)puVar1 = *(uint *)puVar1 | 0x10000;
  bVar3 = SplitConstructorCallCommon
                    (this,newObjInstr,newObjInstr->m_src2,NewScObjectNoCtor,isInlined,isFixed,
                     createObjInstrOut,callCtorInstrOut);
  return bVar3;
}

Assistant:

bool
Inline::SplitConstructorCall(IR::Instr *const newObjInstr, const bool isInlined, const bool isFixed, IR::Instr** createObjInstrOut, IR::Instr** callCtorInstrOut) const
{
    Assert(newObjInstr);
    Assert(newObjInstr->m_opcode == Js::OpCode::NewScObject);
    Assert(newObjInstr->GetSrc1());
    Assert(newObjInstr->GetSrc2());

    this->topFunc->SetHasTempObjectProducingInstr(true);

    return
        SplitConstructorCallCommon(
            newObjInstr,
            newObjInstr->GetSrc2(),
            Js::OpCode::NewScObjectNoCtor,
            isInlined,
            isFixed,
            createObjInstrOut,
            callCtorInstrOut);
}